

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

MixingHashState
absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
          (MixingHashState hash_state,uchar *first,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  MixingHashState MVar4;
  ulong uVar5;
  
  if (size < 0x11) {
    if (8 < size) {
      uVar5 = (*(ulong *)first << 0xb | *(ulong *)first >> 0x35) +
              hash_state.state_ + 0x9ddfea08eb382d69;
      uVar3 = hash_state.state_ + 0x9ddfea08eb382d69 ^ *(ulong *)(first + (size - 8));
      goto LAB_0010dce4;
    }
    if (size < 4) {
      if (size == 0) {
        return (MixingHashState)hash_state.state_;
      }
      uVar3 = (ulong)((uint)first[size - 1] << (((char)size + -1) * '\b' & 0x1fU) | (uint)*first |
                     (uint)first[size >> 1] << ((byte)((int)(size >> 1) << 3) & 0x1f));
    }
    else {
      uVar3 = (ulong)*(uint *)(first + (size - 4)) << ((char)((int)size << 3) - 0x20U & 0x3f) |
              (ulong)*(uint *)first;
    }
  }
  else {
    if (0x400 < size) {
      MVar4.state_ = absl::lts_20240722::hash_internal::MixingHashState::
                     CombineLargeContiguousImpl64(hash_state.state_,first,size);
      return (MixingHashState)MVar4.state_;
    }
    uVar3 = absl::lts_20240722::hash_internal::MixingHashState::LowLevelHashImpl(first,size);
  }
  uVar3 = uVar3 + hash_state.state_;
  uVar5 = 0x9ddfea08eb382d69;
LAB_0010dce4:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  return (MixingHashState)(SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0));
}

Assistant:

static MixingHashState combine_contiguous(MixingHashState hash_state,
                                            const unsigned char* first,
                                            size_t size) {
    return MixingHashState(
        CombineContiguousImpl(hash_state.state_, first, size,
                              std::integral_constant<int, sizeof(size_t)>{}));
  }